

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O0

OutboundPacketStream * __thiscall
osc::OutboundPacketStream::operator<<(OutboundPacketStream *this,float rhs)

{
  char *pcVar1;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  anon_union_4_2_94730044 u;
  float rhs_local;
  OutboundPacketStream *this_local;
  
  CheckForAvailableArgumentSpace(this,4);
  pcVar1 = this->typeTagsCurrent_;
  this->typeTagsCurrent_ = pcVar1 + -1;
  pcVar1[-1] = 'f';
  local_18 = SUB41(rhs,0);
  this->argumentCurrent_[3] = local_18;
  cStack_17 = (char)((uint)rhs >> 8);
  this->argumentCurrent_[2] = cStack_17;
  cStack_16 = (char)((uint)rhs >> 0x10);
  this->argumentCurrent_[1] = cStack_16;
  cStack_15 = (char)((uint)rhs >> 0x18);
  *this->argumentCurrent_ = cStack_15;
  this->argumentCurrent_ = this->argumentCurrent_ + 4;
  return this;
}

Assistant:

OutboundPacketStream& OutboundPacketStream::operator<<( float rhs )
{
    CheckForAvailableArgumentSpace(4);

    *(--typeTagsCurrent_) = FLOAT_TYPE_TAG;

#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        float f;
        char c[4];
    } u;

    u.f = rhs;

    argumentCurrent_[3] = u.c[0];
    argumentCurrent_[2] = u.c[1];
    argumentCurrent_[1] = u.c[2];
    argumentCurrent_[0] = u.c[3];
#else
    *reinterpret_cast<float*>(argumentCurrent_) = rhs;
#endif

    argumentCurrent_ += 4;

    return *this;
}